

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double __thiscall
ON_PlaneEquation::MinimumValueAt
          (ON_PlaneEquation *this,bool bRational,int point_count,int point_stride,double *points,
          double stop_value)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = -1.23432101234321e+308;
  if ((0 < point_count) && (points != (double *)0x0 && (int)(bRational + 3) <= point_stride)) {
    if (1.23432101234321e+308 <= ABS(stop_value)) {
      if (bRational) {
        dVar5 = points[3];
        dVar4 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                        (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
        dVar5 = dVar4 * this->z * points[2] +
                this->x * dVar4 * *points + dVar4 * this->y * points[1] + dVar5;
        iVar3 = point_count + -1;
        if (iVar3 != 0) {
          pdVar2 = points + (ulong)(uint)point_stride + 3;
          dVar4 = dVar5;
          do {
            dVar5 = *pdVar2;
            dVar1 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                            (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
            dVar5 = dVar1 * this->z * pdVar2[-1] +
                    this->x * dVar1 * pdVar2[-3] + this->y * dVar1 * pdVar2[-2] + dVar5;
            if (dVar4 <= dVar5) {
              dVar5 = dVar4;
            }
            pdVar2 = pdVar2 + (uint)point_stride;
            iVar3 = iVar3 + -1;
            dVar4 = dVar5;
          } while (iVar3 != 0);
        }
      }
      else {
        dVar5 = points[2] * this->z + *points * this->x + points[1] * this->y + this->d;
        iVar3 = point_count + -1;
        if (iVar3 != 0) {
          pdVar2 = points + (ulong)(uint)point_stride + 2;
          do {
            dVar4 = *pdVar2 * this->z + pdVar2[-2] * this->x + pdVar2[-1] * this->y + this->d;
            if (dVar5 <= dVar4) {
              dVar4 = dVar5;
            }
            dVar5 = dVar4;
            pdVar2 = pdVar2 + (uint)point_stride;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
    }
    else if (bRational) {
      dVar5 = points[3];
      dVar4 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                      (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
      dVar5 = dVar4 * this->z * points[2] + this->x * dVar4 * *points + dVar4 * this->y * points[1]
              + dVar5;
      if ((stop_value <= dVar5) && (iVar3 = point_count + -1, iVar3 != 0)) {
        pdVar2 = points + (ulong)(uint)point_stride + 3;
        do {
          dVar4 = *pdVar2;
          dVar1 = (double)(~-(ulong)(dVar4 != 0.0) & 0x3ff0000000000000 |
                          (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
          dVar4 = dVar1 * this->z * pdVar2[-1] +
                  this->x * dVar1 * pdVar2[-3] + this->y * dVar1 * pdVar2[-2] + dVar4;
          if ((dVar4 < dVar5) && (dVar5 = dVar4, dVar4 < stop_value)) {
            return dVar4;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    else {
      dVar5 = points[2] * this->z + *points * this->x + points[1] * this->y + this->d;
      if ((stop_value <= dVar5) && (iVar3 = point_count + -1, iVar3 != 0)) {
        pdVar2 = points + (ulong)(uint)point_stride + 2;
        do {
          dVar4 = *pdVar2 * this->z + pdVar2[-2] * this->x + pdVar2[-1] * this->y + this->d;
          if ((dVar4 < dVar5) && (dVar5 = dVar4, dVar4 < stop_value)) {
            return dVar4;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
  }
  return dVar5;
}

Assistant:

double ON_PlaneEquation::MinimumValueAt(
  bool bRational,
  int point_count,
  int point_stride,
  const double* points,
  double stop_value
  ) const
{
  double value, min_value, w;

  if (    point_count < 1 
       || point_stride < (bRational?4:3) 
       || 0 == points
       )
  {
    return ON_UNSET_VALUE;
  }

  if ( ON_IsValid(stop_value) )
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      min_value = x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3];
      if ( min_value < stop_value )
        return min_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3];
        if ( value < min_value )
        {
          if ( (min_value = value) < stop_value )
            return min_value;
        }
      }
    }
    else
    {
      min_value = x*points[0]+y*points[1]+z*points[2]+d;
      if ( min_value < stop_value )
        return min_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = x*points[0]+y*points[1]+z*points[2]+d;
        if ( value < min_value )
        {
          if ( (min_value = value) < stop_value )
            return min_value;
        }
      }
    }
  }
  else
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      min_value = x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3];
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3];
        if ( value < min_value )
          min_value = value;
      }
    }
    else
    {
      min_value = x*points[0]+y*points[1]+z*points[2]+d;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = x*points[0]+y*points[1]+z*points[2]+d;
        if ( value < min_value )
          min_value = value;
      }
    }
  }

  return min_value;
}